

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_tbranch(DisasContext_conflict1 *s,arg_tbranch *a,_Bool half)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *pTVar2;
  undefined7 in_register_00000011;
  MemOp opc;
  uintptr_t o;
  TCGv_i32 var;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 var_00;
  
  s_00 = s->uc->tcg_ctx;
  iVar1 = a->rm;
  a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  var_00 = (TCGv_i32)((long)a1 - (long)s_00);
  load_reg_var(s,var_00,iVar1);
  if ((int)CONCAT71(in_register_00000011,half) != 0) {
    tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)a1);
  }
  iVar1 = a->rn;
  s_01 = s->uc->tcg_ctx;
  pTVar2 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)pTVar2 - (long)s_01);
  load_reg_var(s,var,iVar1);
  pTVar2 = (TCGTemp *)((long)s_00 + (long)var);
  tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)a1);
  opc = MO_8;
  if (half) {
    opc = s->be_data | MO_16;
  }
  gen_aa32_ld_i32(s,var_00,var,s->mmu_idx & 0xf,opc);
  tcg_temp_free_internal_aarch64(s_00,pTVar2);
  tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)a1);
  tcg_gen_addi_i32_aarch64(s_00,var_00,var_00,(int)s->pc_curr + (uint)(s->thumb == 0) * 4 + 4);
  store_reg(s,0xf,var_00);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_tbranch(DisasContext *s, arg_tbranch *a, bool half)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr, tmp;

    tmp = load_reg(s, a->rm);
    if (half) {
        tcg_gen_add_i32(tcg_ctx, tmp, tmp, tmp);
    }
    addr = load_reg(s, a->rn);
    tcg_gen_add_i32(tcg_ctx, addr, addr, tmp);

    gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                    half ? MO_UW | s->be_data : MO_UB);
    tcg_temp_free_i32(tcg_ctx, addr);

    tcg_gen_add_i32(tcg_ctx, tmp, tmp, tmp);
    tcg_gen_addi_i32(tcg_ctx, tmp, tmp, read_pc(s));
    store_reg(s, 15, tmp);
    return true;
}